

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O0

void __thiscall ExprTest_EqualVariable_Test::TestBody(ExprTest_EqualVariable_Test *this)

{
  Reference other;
  Reference other_00;
  Reference other_01;
  Reference other_02;
  Reference other_03;
  NumericConstant other_04;
  Expr e2;
  Expr e2_00;
  Expr e2_01;
  bool bVar1;
  undefined1 uVar2;
  ExprBase assertion_result;
  undefined8 in_RDI;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  undefined4 in_stack_fffffffffffffe80;
  type_conflict in_stack_fffffffffffffe84;
  type_conflict tVar3;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *in_stack_fffffffffffffe88;
  AssertionResult *pAVar4;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffe94;
  undefined4 uVar6;
  undefined8 in_stack_fffffffffffffe98;
  int iVar7;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  Type type;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 uVar8;
  ExprBase in_stack_fffffffffffffeb8;
  ExprBase e1;
  string local_138 [24];
  char *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  AssertionResult *in_stack_fffffffffffffef8;
  AssertHelper *in_stack_ffffffffffffff00;
  AssertionResult local_e8;
  string local_d8 [48];
  BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3> local_a8;
  BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3> local_98;
  AssertionResult local_88;
  string local_78 [64];
  BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3> local_38;
  BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3> local_28;
  AssertionResult local_18;
  
  type = (Type)((ulong)in_RDI >> 0x20);
  iVar7 = (int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  uVar8 = 0;
  local_28.super_ExprBase.impl_ =
       (ExprBase)
       ExprTest::MakeVariable
                 ((ExprTest *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),0);
  other.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffffe94;
  other.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffffe90;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::Reference>
            (in_stack_fffffffffffffe88,other,in_stack_fffffffffffffe84);
  local_38.super_ExprBase.impl_ =
       (ExprBase)
       ExprTest::MakeVariable
                 ((ExprTest *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),0);
  other_00.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffffe94;
  other_00.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffffe90;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::Reference>
            (in_stack_fffffffffffffe88,other_00,in_stack_fffffffffffffe84);
  e2.super_ExprBase.impl_._4_4_ = uVar8;
  e2.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffeb0;
  mp::Equal((Expr)in_stack_fffffffffffffeb8.impl_,e2);
  e1.impl_ = (Impl *)&local_18;
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             (bool)in_stack_fffffffffffffe7f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)e1.impl_);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(uVar8,in_stack_fffffffffffffeb0));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
               in_stack_fffffffffffffee0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(uVar8,in_stack_fffffffffffffeb0),type,
               (char *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),iVar7,
               (char *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff00,(Message *)in_stack_fffffffffffffef8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    std::__cxx11::string::~string(local_78);
    testing::Message::~Message((Message *)0x132ac2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x132b3d);
  uVar6 = 0;
  local_98.super_ExprBase.impl_ =
       (ExprBase)
       ExprTest::MakeVariable
                 ((ExprTest *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),0);
  other_01.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_._4_4_ = uVar6;
  other_01.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffffe90;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::Reference>
            (in_stack_fffffffffffffe88,other_01,in_stack_fffffffffffffe84);
  local_a8.super_ExprBase.impl_ =
       (ExprBase)
       ExprTest::MakeVariable
                 ((ExprTest *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),0);
  other_02.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_._4_4_ = uVar6;
  other_02.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffffe90;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::Reference>
            (in_stack_fffffffffffffe88,other_02,in_stack_fffffffffffffe84);
  e2_00.super_ExprBase.impl_._4_4_ = uVar8;
  e2_00.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffeb0;
  mp::Equal((Expr)e1.impl_,e2_00);
  pAVar4 = &local_88;
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             (bool)in_stack_fffffffffffffe7f);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  iVar7 = (int)((ulong)pAVar4 >> 0x20);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)CONCAT44(uVar8,in_stack_fffffffffffffeb0));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
               in_stack_fffffffffffffee0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(uVar8,in_stack_fffffffffffffeb0),type,
               (char *)CONCAT17(uVar2,in_stack_fffffffffffffea0),iVar7,
               (char *)CONCAT44(uVar6,in_stack_fffffffffffffe90));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff00,(Message *)in_stack_fffffffffffffef8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    std::__cxx11::string::~string(local_d8);
    testing::Message::~Message((Message *)0x132cbd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x132d38);
  tVar3 = 0;
  ExprTest::MakeVariable
            ((ExprTest *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),0);
  other_03.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_._4_4_ = uVar6;
  other_03.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffffe90;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::Reference>
            (in_stack_fffffffffffffe88,other_03,tVar3);
  assertion_result.impl_ =
       (Impl *)ExprTest::MakeConst((ExprTest *)
                                   CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                                   6.20952573137487e-318);
  other_04.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._4_4_ = uVar6;
  other_04.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffffe90;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::NumericConstant>
            (in_stack_fffffffffffffe88,other_04,tVar3);
  e2_01.super_ExprBase.impl_._4_4_ = uVar8;
  e2_01.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffeb0;
  mp::Equal((Expr)e1.impl_,e2_01);
  pAVar4 = &local_e8;
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT44(tVar3,in_stack_fffffffffffffe80),
             (bool)in_stack_fffffffffffffe7f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  uVar5 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe90);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(uVar8,in_stack_fffffffffffffeb0));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)assertion_result.impl_,in_stack_fffffffffffffef0,
               in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(uVar8,in_stack_fffffffffffffeb0),type,
               (char *)CONCAT17(uVar2,in_stack_fffffffffffffea0),iVar7,(char *)CONCAT44(uVar6,uVar5)
              );
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff00,(Message *)assertion_result.impl_);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(tVar3,in_stack_fffffffffffffe80));
    std::__cxx11::string::~string(local_138);
    testing::Message::~Message((Message *)0x132e9b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x132f0a);
  return;
}

Assistant:

TEST_F(ExprTest, EqualVariable) {
  EXPECT_TRUE(Equal(MakeVariable(0), MakeVariable(0)));
  EXPECT_FALSE(Equal(MakeVariable(0), MakeVariable(1)));
  EXPECT_FALSE(Equal(MakeVariable(0), MakeConst(0)));
}